

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fire.hpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
fire::arg::_get<std::__cxx11::string>
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,arg *this)

{
  arg_type aVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fire::_matcher::arg_type>
  elem;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fire::_matcher::arg_type>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  _matcher::get_and_mark_as_queried_abi_cxx11_
            (&local_68,(_matcher *)_storage<void>::matcher,&this->_id);
  aVar1 = local_68.second;
  std::__cxx11::string::string((string *)&bStack_c8,(string *)&(this->_id)._help);
  std::operator+(&local_a8,"argument ",&bStack_c8);
  std::operator+(&local_88,&local_a8," must have value");
  _matcher::deferred_assert
            ((_matcher *)_storage<void>::matcher,&this->_id,aVar1 != bool_t,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&bStack_c8);
  if (local_68.second == string_t) {
    std::__cxx11::string::string((string *)&local_40,(string *)&local_68);
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    optional(__return_storage_ptr__,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    optional(__return_storage_ptr__,&this->_string_value);
  }
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

inline optional<std::string> arg::_get<std::string>() {
        auto elem = _::matcher.get_and_mark_as_queried(_id);
        _::matcher.deferred_assert(_id, elem.second != _matcher::arg_type::bool_t,
                                   "argument " + _id.help() + " must have value");

        if(elem.second == _matcher::arg_type::string_t)
            return elem.first;
        return _string_value;
    }